

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::HttpInputStream::Request> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readRequest(HttpInputStreamImpl *this)

{
  Coroutine<kj::HttpInputStream::Request> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  *__return_storage_ptr___00;
  undefined4 uVar1;
  PromiseArenaMember *node;
  long lVar2;
  long *plVar3;
  SourceLocation location;
  bool bVar4;
  coroutine_handle<void> coroutine;
  undefined8 in_RSI;
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  HttpInputStream local_68;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 local_38;
  
  coroutine._M_fr_ptr = operator_new(0x4e8);
  *(code **)coroutine._M_fr_ptr = readRequest;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readRequest;
  this_00 = (Coroutine<kj::HttpInputStream::Request> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d8) = in_RSI;
  local_58 = 0x50fbd6;
  uStack_54 = 0;
  uStack_50 = 0x510788;
  uStack_4c = 0;
  local_48 = 0x58a;
  uStack_44 = 0x18;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006420e8;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00642130;
  location.function = "readRequest";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x58a;
  location.columnNumber = 0x18;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x4d0);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006420e8;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00642130;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  readRequestHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        *)((long)coroutine._M_fr_ptr + 0x268);
  co_await<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
              *)this_01);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x4e0) = 0;
  bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar4) {
    __return_storage_ptr___00 =
         (OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
          *)((long)coroutine._M_fr_ptr + 0x460);
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::await_resume(__return_storage_ptr___00,__return_storage_ptr__);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x418) == '\x01') {
      if (*(int *)((long)coroutine._M_fr_ptr + 0x420) == 1) {
        *(undefined4 *)((long)coroutine._M_fr_ptr + 0x420) = 0;
      }
      if (*(int *)((long)coroutine._M_fr_ptr + 0x420) == 2) {
        *(undefined4 *)((long)coroutine._M_fr_ptr + 0x420) = 0;
      }
      if (*(int *)((long)coroutine._M_fr_ptr + 0x420) == 3) {
        *(undefined4 *)((long)coroutine._M_fr_ptr + 0x420) = 0;
      }
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x280) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x288));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
    if (node != (PromiseArenaMember *)0x0) {
      (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
    if (__return_storage_ptr___00->tag != 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12]>
                ((Fault *)&stack0xffffffffffffff98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x58d,FAILED,"requestOrProtocolError.tryGet<HttpHeaders::Request>() != nullptr",
                 "\"bad request\"",(char (*) [12])"bad request");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff98);
    }
    lVar2 = *(long *)((long)coroutine._M_fr_ptr + 0x4d8);
    uVar1 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x468);
    local_48 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x47c);
    local_58 = (undefined4)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x46c);
    uStack_54 = (undefined4)((ulong)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x46c) >> 0x20);
    uStack_50 = (undefined4)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x474);
    uStack_4c = (undefined4)((ulong)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x474) >> 0x20);
    local_40 = 1;
    local_38 = uVar1;
    getEntityBody((HttpInputStreamImpl *)&stack0xffffffffffffff98,(RequestOrResponse)lVar2,
                  (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,(uint)&stack0xffffffffffffffc0
                  ,(HttpHeaders *)0x0);
    local_40 = 0;
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4a0) = uVar1;
    *(ulong *)((long)coroutine._M_fr_ptr + 0x4a8) = CONCAT44(uStack_50,uStack_54);
    *(ulong *)((long)coroutine._M_fr_ptr + 0x4b0) = CONCAT44(local_48,uStack_4c);
    *(long *)((long)coroutine._M_fr_ptr + 0x4b8) = lVar2 + 0x48;
    *(_func_int ***)((long)coroutine._M_fr_ptr + 0x4c0) = local_68._vptr_HttpInputStream;
    ((Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&> *)
    ((long)coroutine._M_fr_ptr + 0x4c8))->ptr =
         (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)local_60.currentWrapper.ptr;
    local_60.currentWrapper.ptr =
         (Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>)
         (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
    kj::_::Coroutine<kj::HttpInputStream::Request>::fulfill
              (this_00,(FixVoid<kj::HttpInputStream::Request> *)((long)coroutine._M_fr_ptr + 0x4a0))
    ;
    plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x4c8);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c8) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x4c0))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x4c0),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    if (__return_storage_ptr___00->tag == 1) {
      __return_storage_ptr___00->tag = 0;
    }
    if (__return_storage_ptr___00->tag == 2) {
      __return_storage_ptr___00->tag = 0;
    }
    if (__return_storage_ptr___00->tag == 3) {
      __return_storage_ptr___00->tag = 0;
    }
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x4e0) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Request> readRequest() override {
    auto requestOrProtocolError = co_await readRequestHeaders();
    auto request = KJ_REQUIRE_NONNULL(
        requestOrProtocolError.tryGet<HttpHeaders::Request>(), "bad request");
    auto body = getEntityBody(HttpInputStreamImpl::REQUEST, request.method, 0, headers);

    co_return { request.method, request.url, headers, kj::mv(body) };
  }